

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::processElemDeclIC
          (TraverseSchema *this,DOMElement *icElem,SchemaElementDecl *elemDecl)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ValueVectorOf<xercesc_4_0::DOMElement_*> *this_00;
  RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *this_01;
  RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>
  *this_02;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar3;
  DOMNode *local_30;
  DOMElement *ic;
  ValueVectorOf<xercesc_4_0::DOMElement_*> *icNodes;
  SchemaElementDecl *elemDecl_local;
  DOMElement *icElem_local;
  TraverseSchema *this_local;
  
  ic = (DOMElement *)0x0;
  icNodes = (ValueVectorOf<xercesc_4_0::DOMElement_*> *)elemDecl;
  elemDecl_local = (SchemaElementDecl *)icElem;
  icElem_local = (DOMElement *)this;
  for (local_30 = &icElem->super_DOMNode; local_30 != (DOMNode *)0x0;
      local_30 = &XUtil::getNextSiblingElementNS
                            (local_30,(XMLCh **)fgIdentityConstraints,
                             (XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA,3)->super_DOMNode) {
    iVar2 = (*((DOMNode *)&local_30->_vptr_DOMNode)->_vptr_DOMNode[0x18])();
    bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar2),L"key");
    if (bVar1) {
      traverseKey(this,(DOMElement *)local_30,(SchemaElementDecl *)icNodes);
    }
    else {
      iVar2 = (*((DOMNode *)&local_30->_vptr_DOMNode)->_vptr_DOMNode[0x18])();
      bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_00,iVar2),
                                (XMLCh *)SchemaSymbols::fgELT_UNIQUE);
      if (bVar1) {
        traverseUnique(this,(DOMElement *)local_30,(SchemaElementDecl *)icNodes);
      }
      else {
        if (ic == (DOMElement *)0x0) {
          this_00 = (ValueVectorOf<xercesc_4_0::DOMElement_*> *)
                    XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
          ValueVectorOf<xercesc_4_0::DOMElement_*>::ValueVectorOf
                    (this_00,8,this->fGrammarPoolMemoryManager,false);
          ic = (DOMElement *)this_00;
        }
        ValueVectorOf<xercesc_4_0::DOMElement_*>::addElement
                  ((ValueVectorOf<xercesc_4_0::DOMElement_*> *)ic,(DOMElement **)&local_30);
      }
    }
  }
  if (ic != (DOMElement *)0x0) {
    if (this->fIC_ElementsNS ==
        (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
         *)0x0) {
      this_01 = (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                 *)XMemory::operator_new(0x38,this->fMemoryManager);
      RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::RefHashTableOf(this_01,0xd,this->fMemoryManager);
      this->fIC_ElementsNS = this_01;
      this_02 = (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>
                 *)XMemory::operator_new(0x38,this->fMemoryManager);
      RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>
      ::RefHashTableOf(this_02,0x1d,true,this->fMemoryManager);
      this->fIC_NodeListNS = this_02;
    }
    pVVar3 = RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
             ::get(this->fIC_ElementsNS,this->fTargetNSURIString);
    this->fIC_Elements = pVVar3;
    if (this->fIC_Elements == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
      pVVar3 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
               XMemory::operator_new(0x28,this->fMemoryManager);
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf
                (pVVar3,8,this->fMemoryManager,false);
      this->fIC_Elements = pVVar3;
      RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::put(this->fIC_ElementsNS,this->fTargetNSURIString,this->fIC_Elements);
    }
    RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>,_xercesc_4_0::PtrHasher>::
    put(this->fIC_NodeListNS,icNodes,(ValueVectorOf<xercesc_4_0::DOMElement_*> *)ic);
    ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::addElement
              (this->fIC_Elements,(SchemaElementDecl **)&icNodes);
  }
  return;
}

Assistant:

void TraverseSchema::processElemDeclIC(DOMElement* const icElem,
                                       SchemaElementDecl* const elemDecl)
{
    // key/keyref/unique processing
    ValueVectorOf<DOMElement*>* icNodes = 0;
    DOMElement* ic = icElem;
    while (ic != 0) {

        if (XMLString::equals(ic->getLocalName(), SchemaSymbols::fgELT_KEY)) {
            traverseKey(ic, elemDecl);
        }
        else if (XMLString::equals(ic->getLocalName(), SchemaSymbols::fgELT_UNIQUE)) {
            traverseUnique(ic, elemDecl);
        }
        else {

            if (!icNodes) {
                icNodes = new (fGrammarPoolMemoryManager) ValueVectorOf<DOMElement*>(8, fGrammarPoolMemoryManager);
            }

            icNodes->addElement(ic);
        }

        ic = XUtil::getNextSiblingElementNS(
            ic, fgIdentityConstraints, SchemaSymbols::fgURI_SCHEMAFORSCHEMA, 3);
    }

    if (icNodes) {

        if (!fIC_ElementsNS) {

            fIC_ElementsNS = new (fMemoryManager) RefHashTableOf<ElemVector>(13, fMemoryManager);
            fIC_NodeListNS = new (fMemoryManager) RefHashTableOf<ValueVectorOf<DOMElement*>, PtrHasher>(29, true, fMemoryManager);
        }

        fIC_Elements = fIC_ElementsNS->get(fTargetNSURIString);
        if (!fIC_Elements) {
            fIC_Elements = new (fMemoryManager) ValueVectorOf<SchemaElementDecl*>(8, fMemoryManager);
            fIC_ElementsNS->put((void*) fTargetNSURIString, fIC_Elements);
        }

        fIC_NodeListNS->put(elemDecl, icNodes);
        fIC_Elements->addElement(elemDecl);
    }
}